

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int stem(char **pz,char *zFrom,char *zTo,_func_int_char_ptr *xCond)

{
  int iVar1;
  bool bVar2;
  char *local_38;
  char *z;
  _func_int_char_ptr *xCond_local;
  char *zTo_local;
  char *zFrom_local;
  char **pz_local;
  
  local_38 = *pz;
  zTo_local = zFrom;
  while( true ) {
    bVar2 = false;
    if (*zTo_local != '\0') {
      bVar2 = *zTo_local == *local_38;
    }
    if (!bVar2) break;
    local_38 = local_38 + 1;
    zTo_local = zTo_local + 1;
  }
  if (*zTo_local == '\0') {
    xCond_local = (_func_int_char_ptr *)zTo;
    if ((xCond == (_func_int_char_ptr *)0x0) || (iVar1 = (*xCond)(local_38), iVar1 != 0)) {
      while (*xCond_local != (_func_int_char_ptr)0x0) {
        local_38[-1] = (char)*xCond_local;
        local_38 = local_38 + -1;
        xCond_local = xCond_local + 1;
      }
      *pz = local_38;
      pz_local._4_4_ = 1;
    }
    else {
      pz_local._4_4_ = 1;
    }
  }
  else {
    pz_local._4_4_ = 0;
  }
  return pz_local._4_4_;
}

Assistant:

static int stem(
  char **pz,             /* The word being stemmed (Reversed) */
  const char *zFrom,     /* If the ending matches this... (Reversed) */
  const char *zTo,       /* ... change the ending to this (not reversed) */
  int (*xCond)(const char*)   /* Condition that must be true */
){
  char *z = *pz;
  while( *zFrom && *zFrom==*z ){ z++; zFrom++; }
  if( *zFrom!=0 ) return 0;
  if( xCond && !xCond(z) ) return 1;
  while( *zTo ){
    *(--z) = *(zTo++);
  }
  *pz = z;
  return 1;
}